

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

void __thiscall MinVR::VRDatumInt::~VRDatumInt(VRDatumInt *this)

{
  void *in_RDI;
  
  ~VRDatumInt((VRDatumInt *)0x154f48);
  operator_delete(in_RDI,0x68);
  return;
}

Assistant:

VRDatumInt(const VRInt inVal) :
    VRDatumSpecialized<VRInt, VRCORETYPE_INT>(inVal) {}